

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# quicly.c
# Opt level: O0

int commit_send_packet(quicly_conn_t *conn,quicly_send_context_t *s,
                      en_quicly_send_packet_mode_t mode)

{
  undefined1 *puVar1;
  _func_void_st_quicly_crypto_engine_t_ptr_quicly_conn_t_ptr_ptls_cipher_context_t_ptr_ptls_aead_context_t_ptr_ptls_iovec_t_size_t_size_t_uint64_t_int
  *p_Var2;
  st_quicly_crypto_engine_t *psVar3;
  ptls_cipher_context_t *ppVar4;
  ptls_aead_context_t *ppVar5;
  long lVar6;
  int iVar7;
  ulong uVar8;
  undefined8 *puVar9;
  quicly_sent_t *pqVar10;
  uint64_t uVar11;
  int in_EDX;
  quicly_sentmap_t *map;
  long in_RSI;
  quicly_conn_t *in_RDI;
  uint uVar12;
  size_t sVar13;
  ptls_iovec_t pVar14;
  int ret_1;
  int ret;
  uint16_t length;
  size_t max_size;
  size_t packet_bytes_in_flight;
  size_t datagram_size;
  uint16_t bytes_in_flight;
  quicly_conn_t *in_stack_ffffffffffffff28;
  quicly_sentmap_t *map_00;
  uint32_t in_stack_ffffffffffffff34;
  uint64_t in_stack_ffffffffffffff38;
  quicly_conn_t *arg0;
  quicly_sentmap_t *map_01;
  long local_40;
  
  if (**(long **)(in_RSI + 0x10) == 0) {
    __assert_fail("s->target.cipher->aead != NULL",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/jordicenzano[P]quicly/lib/quicly.c"
                  ,0xbb0,
                  "int commit_send_packet(quicly_conn_t *, quicly_send_context_t *, enum en_quicly_send_packet_mode_t)"
                 );
  }
  if (*(long *)(in_RSI + 0x58) == *(long *)(in_RSI + 0x68)) {
    __assert_fail("s->dst != s->dst_payload_from",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/jordicenzano[P]quicly/lib/quicly.c"
                  ,0xbb2,
                  "int commit_send_packet(quicly_conn_t *, quicly_send_context_t *, enum en_quicly_send_packet_mode_t)"
                 );
  }
  while (*(long *)(in_RSI + 0x58) - *(long *)(in_RSI + 0x68) < 2) {
    puVar1 = *(undefined1 **)(in_RSI + 0x58);
    *(undefined1 **)(in_RSI + 0x58) = puVar1 + 1;
    *puVar1 = 0;
  }
  if (in_EDX == 0) {
    if ((*(long *)(in_RSI + 0x38) != 0) &&
       (*(ulong *)(*(long *)(in_RSI + 0x28) + (*(long *)(in_RSI + 0x38) + -1) * 0x10 + 8) !=
        (ulong)(in_RDI->egress).max_udp_payload_size)) {
      __assert_fail("s->num_datagrams == 0 || s->datagrams[s->num_datagrams - 1].iov_len == conn->egress.max_udp_payload_size"
                    ,
                    "/workspace/llm4binary/github/license_all_cmakelists_25/jordicenzano[P]quicly/lib/quicly.c"
                    ,0xbb9,
                    "int commit_send_packet(quicly_conn_t *, quicly_send_context_t *, enum en_quicly_send_packet_mode_t)"
                   );
    }
    uVar8 = (ulong)(int)((in_RDI->egress).max_udp_payload_size - 0x10);
    if (uVar8 < (ulong)(*(long *)(in_RSI + 0x58) - *(long *)(in_RSI + 0x40))) {
      __assert_fail("s->dst - s->payload_buf.datagram <= max_size",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/jordicenzano[P]quicly/lib/quicly.c"
                    ,0xbbb,
                    "int commit_send_packet(quicly_conn_t *, quicly_send_context_t *, enum en_quicly_send_packet_mode_t)"
                   );
    }
    memset(*(void **)(in_RSI + 0x58),0,(*(long *)(in_RSI + 0x40) + uVar8) - *(long *)(in_RSI + 0x58)
          );
    *(ulong *)(in_RSI + 0x58) = *(long *)(in_RSI + 0x40) + uVar8;
  }
  if ((**(byte **)(in_RSI + 0x18) & 0x80) == 0) {
    if (((in_RDI->application->cipher).egress.key_update_pn.next <= (in_RDI->egress).packet_number)
       && (iVar7 = update_1rtt_egress_key(in_stack_ffffffffffffff28), iVar7 != 0)) {
      return iVar7;
    }
    if (((in_RDI->application->cipher).egress.key_phase & 1) != 0) {
      **(byte **)(in_RSI + 0x18) = **(byte **)(in_RSI + 0x18) | 4;
    }
  }
  else {
    quicly_encode16((uint8_t *)(*(long *)(in_RSI + 0x68) + -4),
                    ((short)*(undefined8 *)(in_RSI + 0x58) - (short)*(undefined8 *)(in_RSI + 0x68))
                    + (short)*(undefined8 *)(*(long *)**(undefined8 **)(in_RSI + 0x10) + 0x38) + 2U
                    | 0x4000);
  }
  quicly_encode16((uint8_t *)(*(long *)(in_RSI + 0x68) + -2),
                  (uint16_t)(in_RDI->egress).packet_number);
  *(long *)(in_RSI + 0x58) =
       *(long *)(*(long *)**(undefined8 **)(in_RSI + 0x10) + 0x38) + *(long *)(in_RSI + 0x58);
  uVar8 = *(long *)(in_RSI + 0x58) - *(long *)(in_RSI + 0x40);
  if ((in_RDI->egress).max_udp_payload_size < uVar8) {
    __assert_fail("datagram_size <= conn->egress.max_udp_payload_size",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/jordicenzano[P]quicly/lib/quicly.c"
                  ,0xbd4,
                  "int commit_send_packet(quicly_conn_t *, quicly_send_context_t *, enum en_quicly_send_packet_mode_t)"
                 );
  }
  p_Var2 = ((in_RDI->super).ctx)->crypto_engine->encrypt_packet;
  psVar3 = ((in_RDI->super).ctx)->crypto_engine;
  ppVar4 = *(ptls_cipher_context_t **)(*(long *)(in_RSI + 0x10) + 8);
  ppVar5 = (ptls_aead_context_t *)**(undefined8 **)(in_RSI + 0x10);
  pVar14 = ptls_iovec_init(*(void **)(in_RSI + 0x40),uVar8);
  sVar13 = *(long *)(in_RSI + 0x18) - *(long *)(in_RSI + 0x40);
  map = (quicly_sentmap_t *)(*(long *)(in_RSI + 0x68) - *(long *)(in_RSI + 0x40));
  map_00 = (quicly_sentmap_t *)(in_RDI->egress).packet_number;
  uVar12 = (uint)(in_EDX == 2);
  (*p_Var2)(psVar3,in_RDI,ppVar4,ppVar5,pVar14,sVar13,(size_t)map,(uint64_t)map_00,uVar12);
  bytes_in_flight = (uint16_t)(sVar13 >> 0x30);
  if ((*(byte *)(in_RSI + 0x20) & 1) == 0) {
    local_40 = 0;
  }
  else {
    local_40 = *(long *)(in_RSI + 0x58) - *(long *)(in_RSI + 0x18);
    *(long *)(in_RSI + 0x50) = *(long *)(in_RSI + 0x50) - local_40;
  }
  iVar7 = quicly_sentmap_is_open(&(in_RDI->egress).loss.sentmap);
  if (iVar7 != 0) {
    quicly_sentmap_commit(map,bytes_in_flight);
  }
  (*((in_RDI->egress).cc.type)->cc_on_sent)
            (&(in_RDI->egress).cc,&(in_RDI->egress).loss,(uint32_t)local_40,(in_RDI->stash).now);
  map_01 = (quicly_sentmap_t *)(in_RDI->stash).now;
  arg0 = in_RDI;
  get_epoch('\0');
  QUICLY_TRACER_PACKET_SENT
            (arg0,in_stack_ffffffffffffff38,CONCAT44(in_stack_ffffffffffffff34,uVar12),
             (size_t)map_00,(uint8_t)((ulong)map >> 0x38),(int)map);
  (in_RDI->egress).packet_number = (in_RDI->egress).packet_number + 1;
  (in_RDI->super).stats.num_packets.sent = (in_RDI->super).stats.num_packets.sent + 1;
  if (in_EDX != 2) {
    (in_RDI->super).stats.num_bytes.sent = uVar8 + (in_RDI->super).stats.num_bytes.sent;
    lVar6 = *(long *)(in_RSI + 0x38);
    *(long *)(in_RSI + 0x38) = lVar6 + 1;
    puVar9 = (undefined8 *)(*(long *)(in_RSI + 0x28) + lVar6 * 0x10);
    *puVar9 = *(undefined8 *)(in_RSI + 0x40);
    puVar9[1] = uVar8;
    *(ulong *)(in_RSI + 0x40) = uVar8 + *(long *)(in_RSI + 0x40);
    *(undefined8 *)(in_RSI + 0x10) = 0;
    *(undefined8 *)(in_RSI + 0x18) = 0;
  }
  if ((((in_RDI->egress).next_pn_to_skip <= (in_RDI->egress).packet_number) &&
      ((*(byte *)(in_RSI + 8) & 0x80) == 0)) && ((in_RDI->super).state < QUICLY_STATE_CLOSING)) {
    iVar7 = quicly_sentmap_prepare
                      (map_01,(uint64_t)arg0,in_stack_ffffffffffffff38,
                       (uint8_t)(in_stack_ffffffffffffff34 >> 0x18));
    if (iVar7 != 0) {
      return iVar7;
    }
    pqVar10 = quicly_sentmap_allocate(map_00,(quicly_sent_acked_cb)map);
    if (pqVar10 == (quicly_sent_t *)0x0) {
      return 0x201;
    }
    quicly_sentmap_commit(map,bytes_in_flight);
    (in_RDI->egress).packet_number = (in_RDI->egress).packet_number + 1;
    uVar11 = calc_next_pn_to_skip
                       ((ptls_context_t *)arg0,in_stack_ffffffffffffff38,in_stack_ffffffffffffff34,
                        (uint64_t)map_00);
    (in_RDI->egress).next_pn_to_skip = uVar11;
  }
  return 0;
}

Assistant:

static int commit_send_packet(quicly_conn_t *conn, quicly_send_context_t *s, enum en_quicly_send_packet_mode_t mode)
{
    size_t datagram_size, packet_bytes_in_flight;

    assert(s->target.cipher->aead != NULL);

    assert(s->dst != s->dst_payload_from);

    /* pad so that the pn + payload would be at least 4 bytes */
    while (s->dst - s->dst_payload_from < QUICLY_MAX_PN_SIZE - QUICLY_SEND_PN_SIZE)
        *s->dst++ = QUICLY_FRAME_TYPE_PADDING;

    if (mode == QUICLY_COMMIT_SEND_PACKET_MODE_FULL_SIZE) {
        assert(s->num_datagrams == 0 || s->datagrams[s->num_datagrams - 1].iov_len == conn->egress.max_udp_payload_size);
        const size_t max_size = conn->egress.max_udp_payload_size - QUICLY_AEAD_TAG_SIZE;
        assert(s->dst - s->payload_buf.datagram <= max_size);
        memset(s->dst, QUICLY_FRAME_TYPE_PADDING, s->payload_buf.datagram + max_size - s->dst);
        s->dst = s->payload_buf.datagram + max_size;
    }

    /* encode packet size, packet number, key-phase */
    if (QUICLY_PACKET_IS_LONG_HEADER(*s->target.first_byte_at)) {
        uint16_t length = s->dst - s->dst_payload_from + s->target.cipher->aead->algo->tag_size + QUICLY_SEND_PN_SIZE;
        /* length is always 2 bytes, see _do_prepare_packet */
        length |= 0x4000;
        quicly_encode16(s->dst_payload_from - QUICLY_SEND_PN_SIZE - 2, length);
    } else {
        if (conn->egress.packet_number >= conn->application->cipher.egress.key_update_pn.next) {
            int ret;
            if ((ret = update_1rtt_egress_key(conn)) != 0)
                return ret;
        }
        if ((conn->application->cipher.egress.key_phase & 1) != 0)
            *s->target.first_byte_at |= QUICLY_KEY_PHASE_BIT;
    }
    quicly_encode16(s->dst_payload_from - QUICLY_SEND_PN_SIZE, (uint16_t)conn->egress.packet_number);

    /* encrypt the packet */
    s->dst += s->target.cipher->aead->algo->tag_size;
    datagram_size = s->dst - s->payload_buf.datagram;
    assert(datagram_size <= conn->egress.max_udp_payload_size);

    conn->super.ctx->crypto_engine->encrypt_packet(conn->super.ctx->crypto_engine, conn, s->target.cipher->header_protection,
                                                   s->target.cipher->aead, ptls_iovec_init(s->payload_buf.datagram, datagram_size),
                                                   s->target.first_byte_at - s->payload_buf.datagram,
                                                   s->dst_payload_from - s->payload_buf.datagram, conn->egress.packet_number,
                                                   mode == QUICLY_COMMIT_SEND_PACKET_MODE_COALESCED);

    /* update CC, commit sentmap */
    if (s->target.ack_eliciting) {
        packet_bytes_in_flight = s->dst - s->target.first_byte_at;
        s->send_window -= packet_bytes_in_flight;
    } else {
        packet_bytes_in_flight = 0;
    }
    if (quicly_sentmap_is_open(&conn->egress.loss.sentmap))
        quicly_sentmap_commit(&conn->egress.loss.sentmap, (uint16_t)packet_bytes_in_flight);

    conn->egress.cc.type->cc_on_sent(&conn->egress.cc, &conn->egress.loss, (uint32_t)packet_bytes_in_flight, conn->stash.now);
    QUICLY_PROBE(PACKET_SENT, conn, conn->stash.now, conn->egress.packet_number, s->dst - s->target.first_byte_at,
                 get_epoch(*s->target.first_byte_at), !s->target.ack_eliciting);

    ++conn->egress.packet_number;
    ++conn->super.stats.num_packets.sent;

    if (mode != QUICLY_COMMIT_SEND_PACKET_MODE_COALESCED) {
        conn->super.stats.num_bytes.sent += datagram_size;
        s->datagrams[s->num_datagrams++] = (struct iovec){.iov_base = s->payload_buf.datagram, .iov_len = datagram_size};
        s->payload_buf.datagram += datagram_size;
        s->target.cipher = NULL;
        s->target.first_byte_at = NULL;
    }

    /* insert PN gap if necessary, registering the PN to the ack queue so that we'd close the connection in the event of receiving
     * an ACK for that gap. */
    if (conn->egress.packet_number >= conn->egress.next_pn_to_skip && !QUICLY_PACKET_IS_LONG_HEADER(s->current.first_byte) &&
        conn->super.state < QUICLY_STATE_CLOSING) {
        int ret;
        if ((ret = quicly_sentmap_prepare(&conn->egress.loss.sentmap, conn->egress.packet_number, conn->stash.now,
                                          QUICLY_EPOCH_1RTT)) != 0)
            return ret;
        if (quicly_sentmap_allocate(&conn->egress.loss.sentmap, on_invalid_ack) == NULL)
            return PTLS_ERROR_NO_MEMORY;
        quicly_sentmap_commit(&conn->egress.loss.sentmap, 0);
        ++conn->egress.packet_number;
        conn->egress.next_pn_to_skip = calc_next_pn_to_skip(conn->super.ctx->tls, conn->egress.packet_number, conn->egress.cc.cwnd,
                                                            conn->egress.max_udp_payload_size);
    }

    return 0;
}